

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_benchmark.c
# Opt level: O0

int unset_test(bitset_container_t *B)

{
  bitset_container_t *in_RDI;
  int x;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x10000; local_c = local_c + 3) {
    bitset_container_remove(in_RDI,(uint16_t)local_c);
  }
  return 0;
}

Assistant:

int unset_test(bitset_container_t* B) {
    int x;
    for (x = 0; x < 1 << 16; x += 3) {
        bitset_container_remove(B, (uint16_t)x);
    }
    return 0;
}